

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayBase.cpp
# Opt level: O0

void amrex::FabArrayBase::flushTileArrayCache(void)

{
  bool bVar1;
  iterator this;
  const_iterator n;
  const_iterator this_00;
  const_iterator tai_it;
  const_iterator tao_it;
  map<amrex::FabArrayBase::BDKey,_std::map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_std::map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>_>_>_>
  *in_stack_ffffffffffffffc8;
  _Rb_tree_const_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_std::map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>_>_>
  local_18;
  iterator local_10;
  _Rb_tree_const_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_std::map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>_>_>
  local_8;
  
  local_10._M_node =
       (_Base_ptr)
       std::
       map<amrex::FabArrayBase::BDKey,_std::map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_std::map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>_>_>_>
       ::begin(in_stack_ffffffffffffffc8);
  std::
  _Rb_tree_const_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_std::map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>_>_>
  ::_Rb_tree_const_iterator(&local_8,&local_10);
  while( true ) {
    this = std::
           map<amrex::FabArrayBase::BDKey,_std::map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_std::map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>_>_>_>
           ::end(in_stack_ffffffffffffffc8);
    std::
    _Rb_tree_const_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_std::map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>_>_>
    ::_Rb_tree_const_iterator(&local_18,(iterator *)&stack0xffffffffffffffe0);
    bVar1 = std::operator!=(&local_8,&local_18);
    if (!bVar1) break;
    std::
    _Rb_tree_const_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_std::map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>_>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_std::map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>_>_>
                  *)0x10102a6);
    n = std::
        map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>
        ::begin((map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>
                 *)in_stack_ffffffffffffffc8);
    while( true ) {
      std::
      _Rb_tree_const_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_std::map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>_>_>
      ::operator->((_Rb_tree_const_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_std::map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>_>_>
                    *)0x10102c1);
      this_00 = std::
                map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>
                ::end((map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>
                       *)in_stack_ffffffffffffffc8);
      bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffd8,(_Self *)&stack0xffffffffffffffd0);
      if (!bVar1) break;
      std::
      _Rb_tree_const_iterator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>
      ::operator->((_Rb_tree_const_iterator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>
                    *)0x10102f1);
      CacheStats::recordErase((CacheStats *)this._M_node,(Long)n._M_node);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>
      ::operator++((_Rb_tree_const_iterator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>
                    *)this_00._M_node);
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_std::map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>_>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_std::map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>_>_>
                  *)this_00._M_node);
  }
  std::
  map<amrex::FabArrayBase::BDKey,_std::map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_std::map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>_>_>_>
  ::clear((map<amrex::FabArrayBase::BDKey,_std::map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_std::map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>_>_>_>
           *)0x101032a);
  return;
}

Assistant:

void
FabArrayBase::flushTileArrayCache ()
{
    for (TACache::const_iterator tao_it = m_TheTileArrayCache.begin();
         tao_it != m_TheTileArrayCache.end(); ++tao_it)
    {
        for (TAMap::const_iterator tai_it = tao_it->second.begin();
             tai_it != tao_it->second.end(); ++tai_it)
        {
            m_TAC_stats.recordErase(tai_it->second.nuse);
        }
    }
    m_TheTileArrayCache.clear();
#ifdef AMREX_MEM_PROFILING
    m_TAC_stats.bytes = 0L;
#endif
}